

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetSetMomentum_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_GetSetMomentum_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *pcVar2;
  long in_RDI;
  Particle<(pica::Dimension)2> *this_01;
  double dVar3;
  FP FVar4;
  char *file;
  double extraout_XMM0_Qa;
  GammaType GVar5;
  AssertHelper *this_02;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  GammaType expectedGamma;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  MomentumType newMomentum;
  ParticleType particle;
  AssertHelper *in_stack_fffffffffffffe60;
  FP3 *in_stack_fffffffffffffe68;
  FP3 *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  int iVar6;
  char *in_stack_fffffffffffffe80;
  MomentumType *in_stack_fffffffffffffe88;
  Type TVar7;
  Particle<(pica::Dimension)2> *in_stack_fffffffffffffe90;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffea0;
  Message *in_stack_fffffffffffffeb8;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult local_138 [2];
  double local_118;
  double *in_stack_fffffffffffffef0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  char *pcVar8;
  char *in_stack_ffffffffffffff08;
  char local_f0 [32];
  FP local_d0;
  AssertionResult local_c8;
  uint local_b4;
  char local_98 [32];
  double local_78;
  AssertionResult local_70;
  Vector3<double> local_60;
  Particle<(pica::Dimension)2> local_48;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
            (in_stack_fffffffffffffea0);
  pica::Vector3<double>::Vector3(&local_60,541200.0,-5.4363,64316500.0);
  pica::Particle<(pica::Dimension)2>::setMomentum
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  TVar7 = (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  *(undefined8 *)(in_RDI + 0x18) = 0x3d719799812dea11;
  dVar3 = pica::Vector3<double>::norm((Vector3<double> *)0x2004f2);
  if (dVar3 < *(double *)(in_RDI + 0x10) || dVar3 == *(double *)(in_RDI + 0x10)) {
    pica::Particle<(pica::Dimension)2>::getMomentum(in_stack_fffffffffffffe90);
    local_d0 = pica::dist(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    pcVar2 = "dist(newMomentum, particle.getMomentum())";
    testing::internal::CmpHelperLE<double,double>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               (double *)in_stack_fffffffffffffef8.ptr_,in_stack_fffffffffffffef0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe90 =
           (Particle<(pica::Dimension)2> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x20074f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe90,TVar7,in_stack_fffffffffffffe80,iVar6,
                 (char *)in_stack_fffffffffffffe70);
      pcVar2 = local_f0;
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
      testing::Message::~Message((Message *)0x2007ac);
    }
    local_b4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x20082d);
  }
  else {
    pica::Particle<(pica::Dimension)2>::getMomentum(in_stack_fffffffffffffe90);
    FVar4 = pica::dist(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_78 = pica::Vector3<double>::norm((Vector3<double> *)0x20053f);
    local_78 = FVar4 / local_78;
    pcVar2 = "dist(newMomentum, particle.getMomentum()) / newMomentum.norm()";
    testing::internal::CmpHelperLE<double,double>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               (double *)in_stack_fffffffffffffef8.ptr_,in_stack_fffffffffffffef0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe90);
      testing::AssertionResult::failure_message((AssertionResult *)0x2005b5);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe90,TVar7,in_stack_fffffffffffffe80,iVar6,
                 (char *)in_stack_fffffffffffffe70);
      pcVar2 = local_98;
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
      testing::Message::~Message((Message *)0x200612);
    }
    local_b4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x200693);
  }
  if (local_b4 == 0) {
    dVar3 = pica::Vector3<double>::norm2(&local_60);
    this_01 = &local_48;
    file = (char *)pica::Particle<(pica::Dimension)2>::getMass(this_01);
    pica::Constants<double>::c(this_01,pcVar2);
    FVar4 = pica::sqr((double)file * extraout_XMM0_Qa);
    pcVar2 = (char *)sqrt(dVar3 / FVar4 + 1.0);
    TVar7 = (Type)((ulong)dVar3 >> 0x20);
    if (ABS((double)pcVar2) < *(double *)(in_RDI + 0x10) ||
        ABS((double)pcVar2) == *(double *)(in_RDI + 0x10)) {
      pcVar8 = pcVar2;
      GVar5 = pica::Particle<(pica::Dimension)2>::getGamma(&local_48);
      this_02 = (AssertHelper *)ABS((double)pcVar2 - GVar5);
      testing::internal::CmpHelperLE<double,double>
                (in_stack_ffffffffffffff08,pcVar8,(double *)in_stack_fffffffffffffef8.ptr_,
                 in_stack_fffffffffffffef0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe90);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x200b1f);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe90,TVar7,file,iVar6,
                   (char *)in_stack_fffffffffffffe70);
        testing::internal::AssertHelper::operator=(this_02,in_stack_fffffffffffffeb8);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x200b6d);
      }
      local_b4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x200be5);
    }
    else {
      pcVar8 = pcVar2;
      GVar5 = pica::Particle<(pica::Dimension)2>::getGamma(&local_48);
      local_118 = ABS((double)pcVar2 - GVar5) / ABS((double)pcVar8);
      testing::internal::CmpHelperLE<double,double>
                (in_stack_ffffffffffffff08,pcVar8,(double *)in_stack_fffffffffffffef8.ptr_,
                 in_stack_fffffffffffffef0);
      iVar6 = (int)((ulong)pcVar2 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffef0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe90);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x20098d);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe90,TVar7,file,iVar6,pcVar2);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
        testing::Message::~Message((Message *)0x2009ea);
      }
      local_b4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x200a6b);
    }
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetMomentum)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;

    ParticleType particle = this->randomParticle();
    MomentumType newMomentum(54.12e+4, -543.63e-2, 643.165e5);
    particle.setMomentum(newMomentum);
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_VECTOR(newMomentum, particle.getMomentum());
    GammaType expectedGamma = sqrt((FP)1 + newMomentum.norm2() / sqr(particle.getMass() * Constants<GammaType >::c()));
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}